

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_header.c
# Opt level: O0

exr_result_t save_chlist(exr_context_t ctxt,exr_attribute_t *a)

{
  bool bVar1;
  int *piVar2;
  long in_RSI;
  long in_RDI;
  exr_attr_chlist_entry_t *centry_1;
  int c_1;
  exr_attr_chlist_entry_t *centry;
  int c;
  int32_t samps [2];
  uint8_t flags [4];
  uint8_t eol;
  int32_t ptype;
  size_t attrsz;
  exr_result_t rv;
  size_t in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int iVar3;
  int local_38;
  int local_34;
  int local_30;
  undefined1 local_29;
  undefined1 local_28;
  undefined1 local_27;
  undefined1 local_26;
  undefined1 local_25;
  int local_24;
  long local_20;
  int local_14;
  long local_10;
  long local_8;
  
  local_20 = 0;
  for (local_38 = 0; local_38 < **(int **)(in_RSI + 0x18); local_38 = local_38 + 1) {
    local_20 = (*(int *)(*(long *)(*(long *)(in_RSI + 0x18) + 8) + (long)local_38 * 0x20) + 1) +
               local_20 + 0x10;
  }
  local_20 = local_20 + 1;
  local_10 = in_RSI;
  local_8 = in_RDI;
  local_14 = save_attr_sz((exr_context_t)
                          CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                          in_stack_ffffffffffffffb0);
  iVar3 = 0;
  while( true ) {
    bVar1 = false;
    if (local_14 == 0) {
      bVar1 = iVar3 < **(int **)(local_10 + 0x18);
    }
    if (!bVar1) break;
    piVar2 = (int *)(*(long *)(*(long *)(local_10 + 0x18) + 8) + (long)iVar3 * 0x20);
    local_24 = piVar2[4];
    local_34 = piVar2[6];
    local_30 = piVar2[7];
    local_29 = (undefined1)piVar2[5];
    local_26 = 0;
    local_27 = 0;
    local_28 = 0;
    priv_from_native32(&local_24,1);
    priv_from_native32(&local_34,2);
    local_14 = (**(code **)(local_8 + 0x30))
                         (local_8,*(undefined8 *)(piVar2 + 2),(long)(*piVar2 + 1),local_8 + 0xb0);
    if (((local_14 != 0) ||
        (local_14 = (**(code **)(local_8 + 0x30))(local_8,&local_24,4,local_8 + 0xb0), local_14 != 0
        )) || (local_14 = (**(code **)(local_8 + 0x30))(local_8,&local_29,4,local_8 + 0xb0),
              local_14 != 0)) break;
    local_14 = (**(code **)(local_8 + 0x30))(local_8,&local_34,8,local_8 + 0xb0);
    iVar3 = iVar3 + 1;
  }
  if (local_14 == 0) {
    local_25 = 0;
    local_14 = (**(code **)(local_8 + 0x30))(local_8,&local_25,1,local_8 + 0xb0);
  }
  return local_14;
}

Assistant:

static exr_result_t
save_chlist (exr_context_t ctxt, const exr_attribute_t* a)
{
    exr_result_t rv;
    size_t       attrsz = 0;
    int32_t      ptype;
    uint8_t      eol;
    uint8_t      flags[4];
    int32_t      samps[2];

    for (int c = 0; c < a->chlist->num_channels; ++c)
    {
        const exr_attr_chlist_entry_t* centry = a->chlist->entries + c;
        attrsz += (size_t) (centry->name.length + 1);
        attrsz += 16;
    }
    // for end of list marker
    attrsz += 1;

    rv = save_attr_sz (ctxt, attrsz);

    for (int c = 0; rv == EXR_ERR_SUCCESS && c < a->chlist->num_channels; ++c)
    {
        const exr_attr_chlist_entry_t* centry = a->chlist->entries + c;

        ptype    = (int32_t) (centry->pixel_type);
        samps[0] = centry->x_sampling;
        samps[1] = centry->y_sampling;

        flags[0] = centry->p_linear;
        flags[1] = flags[2] = flags[3] = 0;

        priv_from_native32 (&ptype, 1);
        priv_from_native32 (samps, 2);

        rv = ctxt->do_write (
            ctxt,
            centry->name.str,
            (uint64_t) (centry->name.length + 1),
            &(ctxt->output_file_offset));
        if (rv != EXR_ERR_SUCCESS) break;
        rv = ctxt->do_write (
            ctxt, &ptype, sizeof (int32_t), &(ctxt->output_file_offset));
        if (rv != EXR_ERR_SUCCESS) break;
        rv = ctxt->do_write (
            ctxt, flags, sizeof (uint8_t) * 4, &(ctxt->output_file_offset));
        if (rv != EXR_ERR_SUCCESS) break;
        rv = ctxt->do_write (
            ctxt, samps, sizeof (int32_t) * 2, &(ctxt->output_file_offset));
    }
    if (rv == EXR_ERR_SUCCESS)
    {
        eol = 0;
        rv  = ctxt->do_write (
            ctxt, &eol, sizeof (uint8_t), &(ctxt->output_file_offset));
    }
    return rv;
}